

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float __thiscall ImGuiMenuColumns::DeclColumns(ImGuiMenuColumns *this,float w0,float w1,float w2)

{
  long in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float in_XMM1_Da;
  float in_XMM2_Da;
  int i;
  undefined4 local_28;
  undefined4 local_18;
  
  *(undefined4 *)(in_RDI + 0xc) = 0;
  fVar1 = ImMax<float>(*(float *)(in_RDI + 0x20),in_XMM0_Da);
  *(float *)(in_RDI + 0x20) = fVar1;
  fVar1 = ImMax<float>(*(float *)(in_RDI + 0x24),in_XMM1_Da);
  *(float *)(in_RDI + 0x24) = fVar1;
  fVar1 = ImMax<float>(*(float *)(in_RDI + 0x28),in_XMM2_Da);
  *(float *)(in_RDI + 0x28) = fVar1;
  for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
    if ((local_18 < 1) || (*(float *)(in_RDI + 0x20 + (long)local_18 * 4) <= 0.0)) {
      local_28 = 0.0;
    }
    else {
      local_28 = *(float *)(in_RDI + 4);
    }
    *(float *)(in_RDI + 0xc) =
         *(float *)(in_RDI + 0x20 + (long)local_18 * 4) + local_28 + *(float *)(in_RDI + 0xc);
  }
  fVar1 = ImMax<float>(*(float *)(in_RDI + 8),*(float *)(in_RDI + 0xc));
  return fVar1;
}

Assistant:

float ImGuiMenuColumns::DeclColumns(float w0, float w1, float w2) // not using va_arg because they promote float to double
{
    NextWidth = 0.0f;
    NextWidths[0] = ImMax(NextWidths[0], w0);
    NextWidths[1] = ImMax(NextWidths[1], w1);
    NextWidths[2] = ImMax(NextWidths[2], w2);
    for (int i = 0; i < 3; i++)
        NextWidth += NextWidths[i] + ((i > 0 && NextWidths[i] > 0.0f) ? Spacing : 0.0f);
    return ImMax(Width, NextWidth);
}